

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O0

void __thiscall
ON_ObjRefEvaluationParameter::ON_ObjRefEvaluationParameter(ON_ObjRefEvaluationParameter *this)

{
  ON_Interval *local_18;
  ON_ObjRefEvaluationParameter *this_local;
  
  this->m_t_type = 0;
  this->m_reserved = 0;
  local_18 = (ON_Interval *)&this->field_0x28;
  do {
    ON_Interval::ON_Interval(local_18);
    local_18 = local_18 + 1;
  } while ((ON_COMPONENT_INDEX *)local_18 != &this->m_t_ci);
  ON_COMPONENT_INDEX::ON_COMPONENT_INDEX(&this->m_t_ci);
  this->m_t[0] = -1.23432101234321e+308;
  this->m_t[1] = -1.23432101234321e+308;
  this->m_t[2] = -1.23432101234321e+308;
  this->m_t[3] = -1.23432101234321e+308;
  return;
}

Assistant:

ON_ObjRefEvaluationParameter::ON_ObjRefEvaluationParameter()
: m_t_type(0)
, m_reserved(0)
{
  m_t[0] = ON_UNSET_VALUE;
  m_t[1] = ON_UNSET_VALUE;
  m_t[2] = ON_UNSET_VALUE;
  m_t[3] = ON_UNSET_VALUE;
}